

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::ReorganizeDataLayerParams::SerializeWithCachedSizes
          (ReorganizeDataLayerParams *this,CodedOutputStream *output)

{
  if (this->mode_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->mode_,output);
  }
  if (this->blocksize_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt64(2,this->blocksize_,output);
    return;
  }
  return;
}

Assistant:

void ReorganizeDataLayerParams::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.ReorganizeDataLayerParams)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.ReorganizeDataLayerParams.ReorganizationType mode = 1;
  if (this->mode() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->mode(), output);
  }

  // uint64 blockSize = 2;
  if (this->blocksize() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt64(2, this->blocksize(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.ReorganizeDataLayerParams)
}